

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O0

int mbedtls_asn1_write_mpi(uchar **p,uchar *start,mbedtls_mpi *X)

{
  uchar *puVar1;
  ulong local_38;
  size_t len;
  int ret;
  mbedtls_mpi *X_local;
  uchar *start_local;
  uchar **p_local;
  
  local_38 = mbedtls_mpi_size(X);
  if (local_38 == 0) {
    local_38 = 1;
  }
  if ((*p < start) || ((ulong)((long)*p - (long)start) < local_38)) {
    p_local._4_4_ = -0x6c;
  }
  else {
    *p = *p + -local_38;
    len._4_4_ = mbedtls_mpi_write_binary(X,*p,local_38);
    if (len._4_4_ == 0) {
      if ((X->s == 1) && ((**p & 0x80) != 0)) {
        if ((long)*p - (long)start < 1) {
          return -0x6c;
        }
        puVar1 = *p;
        *p = puVar1 + -1;
        puVar1[-1] = '\0';
        local_38 = local_38 + 1;
      }
      len._4_4_ = mbedtls_asn1_write_len_and_tag(p,start,local_38,'\x02');
    }
    p_local._4_4_ = len._4_4_;
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_asn1_write_mpi(unsigned char **p, const unsigned char *start, const mbedtls_mpi *X)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len = 0;

    // Write the MPI
    //
    len = mbedtls_mpi_size(X);

    /* DER represents 0 with a sign bit (0=nonnegative) and 7 value bits, not
     * as 0 digits. We need to end up with 020100, not with 0200. */
    if (len == 0) {
        len = 1;
    }

    if (*p < start || (size_t) (*p - start) < len) {
        return MBEDTLS_ERR_ASN1_BUF_TOO_SMALL;
    }

    (*p) -= len;
    MBEDTLS_MPI_CHK(mbedtls_mpi_write_binary(X, *p, len));

    // DER format assumes 2s complement for numbers, so the leftmost bit
    // should be 0 for positive numbers and 1 for negative numbers.
    //
    if (X->s == 1 && **p & 0x80) {
        if (*p - start < 1) {
            return MBEDTLS_ERR_ASN1_BUF_TOO_SMALL;
        }

        *--(*p) = 0x00;
        len += 1;
    }

    ret = mbedtls_asn1_write_len_and_tag(p, start, len, MBEDTLS_ASN1_INTEGER);

cleanup:
    return ret;
}